

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

InternalParseResult * __thiscall
Catch::Clara::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  string *optToken;
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  Token *pTVar4;
  ParserResult *this_00;
  ParserResult result;
  TokenStream remainingTokens;
  ParseState local_d8;
  undefined1 local_a8 [40];
  Result validationResult;
  Token local_50;
  
  (*(this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
    super_ParserBase._vptr_ParserBase[2])(&validationResult);
  if (validationResult.super_ResultValueBase<void>.super_ResultBase.m_type != Ok) {
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,&validationResult);
    goto LAB_001525eb;
  }
  Detail::TokenStream::TokenStream(&remainingTokens,tokens);
  if ((remainingTokens.m_tokenBuffer.
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       remainingTokens.m_tokenBuffer.
       super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (remainingTokens.it._M_current == remainingTokens.itEnd._M_current)) {
LAB_001525b6:
    result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._vptr_ResultBase.
    _0_4_ = 1;
    Detail::TokenStream::TokenStream
              ((TokenStream *)
               &result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type,
               &remainingTokens);
    Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
              (__return_storage_ptr__,(ParseState *)&result);
    std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
              ((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_> *)
               &result.m_errorMessage._M_string_length);
  }
  else {
    pTVar4 = Detail::TokenStream::operator->(&remainingTokens);
    if (pTVar4->type != Option) goto LAB_001525b6;
    Detail::TokenStream::operator*(&local_50,&remainingTokens);
    optToken = &local_50.token;
    bVar2 = isMatch(this,optToken);
    if (!bVar2) {
      std::__cxx11::string::~string((string *)optToken);
      goto LAB_001525b6;
    }
    iVar3 = (*((this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
               super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->_vptr_BoundRef[3])();
    peVar1 = (this->super_ParserRefImpl<Catch::Clara::Opt>).m_ref.
             super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((char)iVar3 == '\0') {
      Detail::TokenStream::operator++(&remainingTokens);
      if ((remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           remainingTokens.m_tokenBuffer.
           super__Vector_base<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (remainingTokens.it._M_current == remainingTokens.itEnd._M_current)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                       "Expected argument following ",optToken);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                  (__return_storage_ptr__,(string *)&result);
        this_00 = &result;
      }
      else {
        Detail::TokenStream::operator*((Token *)local_a8,&remainingTokens);
        if (local_a8._0_4_ == Argument) {
          this_00 = (ParserResult *)(local_a8 + 8);
          (*peVar1->_vptr_BoundRef[4])(&result,peVar1,this_00);
          if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type ==
              Ok) {
            (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_
                != 2) {
              Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
              std::__cxx11::string::~string((string *)this_00);
              goto LAB_0015274b;
            }
            (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._4_4_,
                                  result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                                  super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
            local_d8.m_type =
                 result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_
            ;
            Detail::TokenStream::TokenStream(&local_d8.m_remainingTokens,&remainingTokens);
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,&local_d8);
            std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
            ~vector(&local_d8.m_remainingTokens.m_tokenBuffer);
          }
          else {
            Detail::BasicResult<Catch::Clara::Detail::ParseState>::
            BasicResult<Catch::Clara::ParseResultType>(__return_storage_ptr__,&result);
          }
          Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,"Expected argument following ",optToken);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)&result);
          std::__cxx11::string::~string((string *)&result);
          this_00 = (ParserResult *)(local_a8 + 8);
        }
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    else {
      (*peVar1->_vptr_BoundRef[4])(&result,peVar1,1);
      if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.m_type == Ok)
      {
        (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._4_4_,
                              result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
        if (result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_ != 2
           ) {
          Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
LAB_0015274b:
          Detail::TokenStream::operator++(&remainingTokens);
          result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.
          _vptr_ResultBase._0_4_ = 0;
          Detail::TokenStream::TokenStream
                    ((TokenStream *)
                     &result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase.
                      m_type,&remainingTokens);
          Detail::BasicResult<Catch::Clara::Detail::ParseState>::
          ok<Catch::Clara::Detail::ParseState>(__return_storage_ptr__,(ParseState *)&result);
          std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
          ~vector((vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>
                   *)&result.m_errorMessage._M_string_length);
          goto LAB_001527dd;
        }
        (**(code **)(CONCAT44(result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._4_4_,
                              result.super_ResultValueBase<Catch::Clara::ParseResultType>.
                              super_ResultBase._vptr_ResultBase._0_4_) + 0x10))();
        local_d8.m_type =
             result.super_ResultValueBase<Catch::Clara::ParseResultType>.super_ResultBase._12_4_;
        Detail::TokenStream::TokenStream(&local_d8.m_remainingTokens,&remainingTokens);
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::ok<Catch::Clara::Detail::ParseState>
                  (__return_storage_ptr__,&local_d8);
        std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::
        ~vector(&local_d8.m_remainingTokens.m_tokenBuffer);
      }
      else {
        Detail::BasicResult<Catch::Clara::Detail::ParseState>::
        BasicResult<Catch::Clara::ParseResultType>(__return_storage_ptr__,&result);
      }
      Detail::BasicResult<Catch::Clara::ParseResultType>::~BasicResult(&result);
    }
LAB_001527dd:
    std::__cxx11::string::~string((string *)optToken);
  }
  std::vector<Catch::Clara::Detail::Token,_std::allocator<Catch::Clara::Detail::Token>_>::~vector
            (&remainingTokens.m_tokenBuffer);
LAB_001525eb:
  Detail::BasicResult<void>::~BasicResult(&validationResult);
  return __return_storage_ptr__;
}

Assistant:

Detail::InternalParseResult Opt::parse(std::string const&,
                                       Detail::TokenStream const& tokens) const {
            auto validationResult = validate();
            if (!validationResult)
                return Detail::InternalParseResult(validationResult);

            auto remainingTokens = tokens;
            if (remainingTokens &&
                remainingTokens->type == Detail::TokenType::Option) {
                auto const& token = *remainingTokens;
                if (isMatch(token.token)) {
                    if (m_ref->isFlag()) {
                        auto flagRef =
                            static_cast<Detail::BoundFlagRefBase*>(
                                m_ref.get());
                        auto result = flagRef->setFlag(true);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    } else {
                        auto valueRef =
                            static_cast<Detail::BoundValueRefBase*>(
                                m_ref.get());
                        ++remainingTokens;
                        if (!remainingTokens)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        auto const& argToken = *remainingTokens;
                        if (argToken.type != Detail::TokenType::Argument)
                            return Detail::InternalParseResult::runtimeError(
                                "Expected argument following " +
                                token.token);
                        const auto result = valueRef->setValue(argToken.token);
                        if (!result)
                            return Detail::InternalParseResult(result);
                        if (result.value() ==
                            ParseResultType::ShortCircuitAll)
                            return Detail::InternalParseResult::ok(Detail::ParseState(
                                result.value(), remainingTokens));
                    }
                    return Detail::InternalParseResult::ok(Detail::ParseState(
                        ParseResultType::Matched, ++remainingTokens));
                }
            }
            return Detail::InternalParseResult::ok(
                Detail::ParseState(ParseResultType::NoMatch, remainingTokens));
        }